

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O1

void __thiscall tf::Executor::Executor(Executor *this,size_t N)

{
  long *plVar1;
  int iVar2;
  char *pcVar3;
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  std::condition_variable::condition_variable(&this->_topology_cv);
  (this->_wsq_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->_num_topologies = 0;
  *(undefined8 *)((long)&(this->_wsq_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_wsq_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_wsq_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_wsq_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->_topology_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_topology_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->_topology_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->_topology_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_taskflow_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->_topology_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_taskflow_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_taskflow_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_taskflow_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_taskflow_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->_wids)._M_h._M_buckets = &(this->_wids)._M_h._M_single_bucket;
  (this->_wids)._M_h._M_bucket_count = 1;
  (this->_wids)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_wids)._M_h._M_element_count = 0;
  (this->_wids)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_wids)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_wids)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::vector<tf::Worker,_std::allocator<tf::Worker>_>::vector
            (&this->_workers,N,(allocator_type *)local_50);
  (this->_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_taskflows).super__List_base<tf::Taskflow,_std::allocator<tf::Taskflow>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->_taskflows;
  (this->_taskflows).super__List_base<tf::Taskflow,_std::allocator<tf::Taskflow>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->_taskflows;
  (this->_taskflows).super__List_base<tf::Taskflow,_std::allocator<tf::Taskflow>_>._M_impl._M_node.
  _M_size = 0;
  Notifier::Notifier(&this->_notifier,N);
  TaskQueue<tf::Node_*>::TaskQueue(&this->_wsq,0x400);
  (this->_num_actives).super___atomic_base<unsigned_long>._M_i = 0;
  (this->_num_thieves).super___atomic_base<unsigned_long>._M_i = 0;
  (this->_done)._M_base._M_i = false;
  (this->_observers)._M_h._M_buckets = &(this->_observers)._M_h._M_single_bucket;
  (this->_observers)._M_h._M_bucket_count = 1;
  (this->_observers)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_observers)._M_h._M_element_count = 0;
  (this->_observers)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_observers)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_observers)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (N == 0) {
    throw_re<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/taskflow/taskflow/core/executor.hpp"
               ,0x2b2,(char (*) [36])"no cpu workers to execute taskflows");
  }
  _spawn(this,N);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"TF_ENABLE_PROFILER","");
  plVar1 = local_50[0];
  pcVar3 = getenv((char *)local_50[0]);
  if (plVar1 != local_40) {
    operator_delete(plVar1,local_40[0] + 1);
  }
  if (pcVar3 != (char *)0x0) {
    if (TFProfManager::get()::mgr == '\0') {
      iVar2 = __cxa_guard_acquire(&TFProfManager::get()::mgr);
      if (iVar2 != 0) {
        TFProfManager::TFProfManager((TFProfManager *)TFProfManager::get()::mgr);
        __cxa_atexit(TFProfManager::~TFProfManager,TFProfManager::get()::mgr,&__dso_handle);
        __cxa_guard_release(&TFProfManager::get()::mgr);
      }
    }
    make_observer<tf::TFProfObserver>((Executor *)local_60);
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)(TFProfManager::get()::mgr + 0x20));
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    std::
    vector<std::shared_ptr<tf::TFProfObserver>,std::allocator<std::shared_ptr<tf::TFProfObserver>>>
    ::emplace_back<std::shared_ptr<tf::TFProfObserver>>
              ((vector<std::shared_ptr<tf::TFProfObserver>,std::allocator<std::shared_ptr<tf::TFProfObserver>>>
                *)(TFProfManager::get()::mgr + 0x48),(shared_ptr<tf::TFProfObserver> *)local_60);
    pthread_mutex_unlock((pthread_mutex_t *)(TFProfManager::get()::mgr + 0x20));
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
    }
  }
  return;
}

Assistant:

inline Executor::Executor(size_t N) :
  _workers    {N},
  _notifier   {N} {

  if(N == 0) {
    TF_THROW("no cpu workers to execute taskflows");
  }

  _spawn(N);

  // instantite the default observer if requested
  if(has_env(TF_ENABLE_PROFILER)) {
    TFProfManager::get()._manage(make_observer<TFProfObserver>());
  }
}